

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_colr_v2(opj_jp2_v2_t *jp2,uchar *p_colr_header_data,OPJ_UINT32 p_colr_header_size,
                         opj_event_mgr_t *p_manager)

{
  undefined8 in_RAX;
  uchar *__s;
  char *fmt;
  opj_bool oVar1;
  uint uVar2;
  ulong uVar3;
  OPJ_UINT32 l_value;
  undefined8 uStack_38;
  
  if (p_colr_header_size < 3) {
    fmt = "Bad COLR header box (bad size)\n";
LAB_001f7296:
    oVar1 = 0;
    opj_event_msg_v2(p_manager,1,fmt);
  }
  else {
    if ((jp2->color).jp2_has_colr == '\0') {
      uStack_38 = in_RAX;
      opj_read_bytes_LE(p_colr_header_data,&jp2->meth,1);
      opj_read_bytes_LE(p_colr_header_data + 1,&jp2->precedence,1);
      opj_read_bytes_LE(p_colr_header_data + 2,&jp2->approx,1);
      if (jp2->meth == 2) {
        uVar2 = p_colr_header_size - 3;
        (jp2->color).icc_profile_len = uVar2;
        __s = (uchar *)malloc((long)(int)uVar2);
        (jp2->color).icc_profile_buf = __s;
        memset(__s,0,(long)(int)uVar2);
        if (0 < (int)uVar2) {
          uVar3 = 0;
          do {
            opj_read_bytes_LE(p_colr_header_data + 3 + uVar3,(OPJ_UINT32 *)((long)&uStack_38 + 4),1)
            ;
            (jp2->color).icc_profile_buf[uVar3] = uStack_38._4_1_;
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
      }
      else if (jp2->meth == 1) {
        if (p_colr_header_size != 7) {
          fmt = "Bad BPCC header box (bad size)\n";
          goto LAB_001f7296;
        }
        opj_read_bytes_LE(p_colr_header_data + 3,&jp2->enumcs,4);
      }
      else {
        opj_event_msg_v2(p_manager,4,
                         "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n"
                        );
      }
      (jp2->color).jp2_has_colr = '\x01';
    }
    else {
      opj_event_msg_v2(p_manager,4,
                       "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n"
                      );
    }
    oVar1 = 1;
  }
  return oVar1;
}

Assistant:

static opj_bool jp2_read_colr_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_colr_header_data,
							OPJ_UINT32 p_colr_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_colr_header_data != 00);
	assert(p_manager != 00);

	if (p_colr_header_size < 3) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Bad COLR header box (bad size)\n");
		return OPJ_FALSE;
	}

	/* Part 1, I.5.3.3 : 'A conforming JP2 reader shall ignore all Colour
	 * Specification boxes after the first.'
	*/
	if(jp2->color.jp2_has_colr) {
		opj_event_msg_v2(p_manager, EVT_INFO, "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n");
		p_colr_header_data += p_colr_header_size;
		return OPJ_TRUE;
	}

	opj_read_bytes(p_colr_header_data,&jp2->meth ,1);			/* METH */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->precedence ,1);		/* PRECEDENCE */
	++p_colr_header_data;

	opj_read_bytes(p_colr_header_data,&jp2->approx ,1);			/* APPROX */
	++p_colr_header_data;

	if (jp2->meth == 1) {
		if (p_colr_header_size != 7) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Bad BPCC header box (bad size)\n");
			return OPJ_FALSE;
		}

		opj_read_bytes(p_colr_header_data,&jp2->enumcs ,4);			/* EnumCS */
	}
	else if (jp2->meth == 2) {
		/* ICC profile */
		int it_icc_value = 0;
		int icc_len = p_colr_header_size - 3;

		jp2->color.icc_profile_len = icc_len;
		jp2->color.icc_profile_buf = (unsigned char*) opj_malloc(icc_len);

		memset(jp2->color.icc_profile_buf, 0, icc_len * sizeof(unsigned char));

		for (it_icc_value = 0; it_icc_value < icc_len; ++it_icc_value)
		{
			opj_read_bytes(p_colr_header_data,&l_value,1);		/* icc values */
			++p_colr_header_data;
			jp2->color.icc_profile_buf[it_icc_value] = (OPJ_BYTE) l_value;
		}

	}
	else /* TODO MSD */
		opj_event_msg_v2(p_manager, EVT_INFO, "COLR BOX meth value is not a regular value (%d), so we will skip the fields following the approx field.\n", jp2->meth);

	jp2->color.jp2_has_colr = 1;

	return OPJ_TRUE;
}